

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O3

void toml::detail::skip_string_like<toml::type_config>
               (location *loc,context<toml::type_config> *param_2)

{
  element_type *peVar1;
  long lVar2;
  element_type *peVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  literal local_b0;
  region local_98;
  
  local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cfa08;
  local_b0.value_ = "\"\"\"";
  local_b0.size_ = 3;
  literal::scan(&local_98,&local_b0,loc);
  peVar1 = local_98.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  region::~region(&local_98);
  if (peVar1 == (element_type *)0x0) {
    local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cfa08;
    local_b0.value_ = "\'\'\'";
    local_b0.size_ = 3;
    literal::scan(&local_98,&local_b0,loc);
    peVar3 = local_98.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    region::~region(&local_98);
    peVar1 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar6 = loc->location_;
    lVar2 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - lVar2;
    if (peVar3 == (element_type *)0x0) {
      if (uVar6 < uVar4) {
        if (*(char *)(lVar2 + uVar6) == '\'') {
          if (uVar6 < uVar4) {
            sVar5 = loc->line_number_;
            sVar7 = loc->column_number_;
            do {
              uVar8 = uVar6 + 1;
              if (uVar8 < uVar4) {
                if (*(char *)(lVar2 + uVar6) == '\n') {
                  sVar5 = sVar5 + 1;
                  loc->line_number_ = sVar5;
                  sVar7 = 1;
                }
                else {
                  sVar7 = sVar7 + 1;
                }
                loc->column_number_ = sVar7;
                loc->location_ = uVar8;
                if ((*(char *)(lVar2 + uVar8) == '\n') || (*(char *)(lVar2 + uVar8) == '\'')) {
                  uVar9 = uVar6 + 2;
                  if (uVar9 < uVar4) goto LAB_00384bf1;
                  if (uVar4 != uVar8) {
                    uVar6 = uVar6 + 1;
                    do {
                      if (*(char *)(lVar2 + uVar6) == '\n') {
                        sVar5 = sVar5 + 1;
                        loc->line_number_ = sVar5;
                        sVar7 = 1;
                      }
                      else {
                        sVar7 = sVar7 + 1;
                      }
                      loc->column_number_ = sVar7;
                      uVar6 = uVar6 + 1;
                    } while (uVar4 != uVar6);
                  }
                  goto LAB_00384c3d;
                }
              }
              else {
                do {
                  if (*(char *)(lVar2 + uVar6) == '\n') {
                    sVar5 = sVar5 + 1;
                    loc->line_number_ = sVar5;
                    sVar7 = 1;
                  }
                  else {
                    sVar7 = sVar7 + 1;
                  }
                  loc->column_number_ = sVar7;
                  uVar6 = uVar6 + 1;
                } while (uVar4 != uVar6);
                loc->location_ = uVar4;
                uVar8 = uVar4;
              }
              uVar6 = uVar8;
            } while (uVar6 < uVar4);
          }
        }
        else if ((*(char *)(lVar2 + uVar6) == '\"') && (uVar6 < uVar4)) {
          sVar5 = loc->line_number_;
          sVar7 = loc->column_number_;
          do {
            uVar8 = uVar6 + 1;
            if (uVar8 < uVar4) {
              if (*(char *)(lVar2 + uVar6) == '\n') {
                sVar5 = sVar5 + 1;
                loc->line_number_ = sVar5;
                sVar7 = 1;
              }
              else {
                sVar7 = sVar7 + 1;
              }
              loc->column_number_ = sVar7;
              loc->location_ = uVar8;
              if ((*(char *)(lVar2 + uVar8) == '\n') || (*(char *)(lVar2 + uVar8) == '\"')) {
                uVar9 = uVar6 + 2;
                if (uVar9 < uVar4) {
LAB_00384bf1:
                  if (*(char *)(lVar2 + uVar8) == '\n') {
                    loc->line_number_ = sVar5 + 1;
                    sVar7 = 1;
                  }
                  else {
                    sVar7 = sVar7 + 1;
                  }
                  loc->column_number_ = sVar7;
                  uVar4 = uVar9;
                }
                else if (uVar4 != uVar8) {
                  uVar6 = uVar6 + 1;
                  do {
                    if (*(char *)(lVar2 + uVar6) == '\n') {
                      sVar5 = sVar5 + 1;
                      loc->line_number_ = sVar5;
                      sVar7 = 1;
                    }
                    else {
                      sVar7 = sVar7 + 1;
                    }
                    loc->column_number_ = sVar7;
                    uVar6 = uVar6 + 1;
                  } while (uVar4 != uVar6);
                }
LAB_00384c3d:
                loc->location_ = uVar4;
                return;
              }
            }
            else {
              do {
                if (*(char *)(lVar2 + uVar6) == '\n') {
                  sVar5 = sVar5 + 1;
                  loc->line_number_ = sVar5;
                  sVar7 = 1;
                }
                else {
                  sVar7 = sVar7 + 1;
                }
                loc->column_number_ = sVar7;
                uVar6 = uVar6 + 1;
              } while (uVar4 != uVar6);
              loc->location_ = uVar4;
              uVar8 = uVar4;
            }
            uVar6 = uVar8;
          } while (uVar6 < uVar4);
        }
      }
    }
    else if (uVar6 < uVar4) {
      do {
        local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cfa08;
        local_b0.value_ = "\'\'\'";
        local_b0.size_ = 3;
        literal::scan(&local_98,&local_b0,loc);
        peVar1 = local_98.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        region::~region(&local_98);
        if (peVar1 != (element_type *)0x0) {
          return;
        }
        peVar1 = (loc->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        uVar6 = loc->location_;
        lVar2 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
        uVar4 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - lVar2;
        if (uVar6 + 1 < uVar4) {
          if (*(char *)(lVar2 + uVar6) == '\n') {
            loc->line_number_ = loc->line_number_ + 1;
            sVar5 = 1;
          }
          else {
            sVar5 = loc->column_number_ + 1;
          }
          loc->column_number_ = sVar5;
          uVar6 = uVar6 + 1;
        }
        else if (uVar4 != uVar6) {
          sVar5 = loc->line_number_;
          sVar7 = loc->column_number_;
          do {
            if (*(char *)(lVar2 + uVar6) == '\n') {
              sVar5 = sVar5 + 1;
              loc->line_number_ = sVar5;
              sVar7 = 1;
            }
            else {
              sVar7 = sVar7 + 1;
            }
            loc->column_number_ = sVar7;
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
          goto LAB_00384b9c;
        }
        loc->location_ = uVar6;
      } while (uVar6 < uVar4);
    }
  }
  else {
    peVar1 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (loc->location_ <
        (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start)) {
      do {
        local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cfa08;
        local_b0.value_ = "\"\"\"";
        local_b0.size_ = 3;
        literal::scan(&local_98,&local_b0,loc);
        peVar1 = local_98.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        region::~region(&local_98);
        if (peVar1 != (element_type *)0x0) {
          return;
        }
        peVar1 = (loc->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        uVar6 = loc->location_;
        lVar2 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
        uVar4 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - lVar2;
        if (uVar6 + 1 < uVar4) {
          if (*(char *)(lVar2 + uVar6) == '\n') {
            loc->line_number_ = loc->line_number_ + 1;
            sVar5 = 1;
          }
          else {
            sVar5 = loc->column_number_ + 1;
          }
          loc->column_number_ = sVar5;
          uVar6 = uVar6 + 1;
        }
        else if (uVar4 != uVar6) {
          sVar5 = loc->line_number_;
          sVar7 = loc->column_number_;
          do {
            if (*(char *)(lVar2 + uVar6) == '\n') {
              sVar5 = sVar5 + 1;
              loc->line_number_ = sVar5;
              sVar7 = 1;
            }
            else {
              sVar7 = sVar7 + 1;
            }
            loc->column_number_ = sVar7;
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
LAB_00384b9c:
          loc->location_ = uVar4;
          return;
        }
        loc->location_ = uVar6;
      } while (uVar6 < uVar4);
    }
  }
  return;
}

Assistant:

void skip_string_like(location& loc, const context<TC>&)
{
    // if """ is found, skip until the closing """ is found.
    if(literal("\"\"\"").scan(loc).is_ok())
    {
        while( ! loc.eof())
        {
            if(literal("\"\"\"").scan(loc).is_ok())
            {
                return;
            }
            loc.advance();
        }
    }
    else if(literal("'''").scan(loc).is_ok())
    {
        while( ! loc.eof())
        {
            if(literal("'''").scan(loc).is_ok())
            {
                return;
            }
            loc.advance();
        }
    }
    // if " is found, skip until the closing " or newline is found.
    else if(loc.current() == '"')
    {
        while( ! loc.eof())
        {
            loc.advance();
            if(loc.current() == '"' || loc.current() == '\n')
            {
                loc.advance();
                return;
            }
        }
    }
    else if(loc.current() == '\'')
    {
        while( ! loc.eof())
        {
            loc.advance();
            if(loc.current() == '\'' || loc.current() == '\n')
            {
                loc.advance();
                return ;
            }
        }
    }
    return;
}